

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void passed(void)

{
  clock_t mo;
  clock_t mu;
  
  printf(" PASSED ");
  printf(" (Moira: %.2fs  Musashi: %.2fs)",(double)moclk[0] / 1000000.0,(double)muclk[0] / 1000000.0
        );
  printf("\n");
  return;
}

Assistant:

void passed()
{
    printf(" PASSED ");
    if (PROFILE_DASM || PROFILE_CPU) {

        clock_t mu = 0, mo = 0;
        if (PROFILE_CPU) { mu += muclk[0]; mo += moclk[0]; }
        if (PROFILE_DASM) { mu += muclk[1]; mo += moclk[1]; }

        printf(" (Moira: %.2fs  Musashi: %.2fs)",
               mo / double(CLOCKS_PER_SEC),
               mu / double(CLOCKS_PER_SEC));
    }
    printf("\n");
}